

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O0

void __thiscall
sglr::ReferenceContext::texStorage3D
          (ReferenceContext *this,deUint32 target,int levels,deUint32 internalFormat,int width,
          int height,int depth)

{
  bool bVar1;
  deBool dVar2;
  int iVar3;
  int iVar4;
  int depth_00;
  byte bVar5;
  TextureCubeArray *local_b0;
  Texture3D *local_a8;
  Texture2DArray *local_a0;
  int levelH_2;
  int levelW_2;
  int level_2;
  TextureCubeArray *texture_2;
  int levelD;
  int levelH_1;
  int levelW_1;
  int level_1;
  Texture3D *texture_1;
  int levelH;
  int levelW;
  int level;
  Texture2DArray *texture;
  TextureFormat local_38;
  TextureFormat storageFmt;
  TextureUnit *unit;
  int height_local;
  int width_local;
  deUint32 internalFormat_local;
  int levels_local;
  deUint32 target_local;
  ReferenceContext *this_local;
  
  storageFmt = (TextureFormat)
               std::
               vector<sglr::ReferenceContext::TextureUnit,_std::allocator<sglr::ReferenceContext::TextureUnit>_>
               ::operator[](&this->m_textureUnits,(long)this->m_activeTexture);
  tcu::TextureFormat::TextureFormat(&local_38);
  do {
    if ((width < 1) || (height < 1)) {
      setError(this,0x501);
      return;
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  do {
    iVar3 = de::max<int>(width,height);
    iVar3 = ::deLog2Floor32(iVar3);
    bVar1 = de::inRange<int>(levels,1,iVar3 + 1);
    if (!bVar1) {
      setError(this,0x501);
      return;
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  local_38 = mapInternalFormat(internalFormat);
  do {
    if ((local_38.order == CHANNELORDER_LAST) || (local_38.type == CHANNELTYPE_LAST)) {
      setError(this,0x500);
      return;
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  if (target == 0x8c1a) {
    if (*(long *)((long)storageFmt + 0x18) == 0) {
      local_a0 = (Texture2DArray *)((long)storageFmt + 0x2ba8);
    }
    else {
      local_a0 = *(Texture2DArray **)((long)storageFmt + 0x18);
    }
    do {
      if ((((this->m_limits).maxTexture2DSize < width) ||
          ((this->m_limits).maxTexture2DSize <= height)) ||
         ((this->m_limits).maxTexture2DArrayLayers <= depth)) {
        setError(this,0x501);
        return;
      }
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
    do {
      bVar1 = rc::Texture::isImmutable(&local_a0->super_Texture);
      if (bVar1) {
        setError(this,0x502);
        return;
      }
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
    rc::Texture2DArray::clearLevels(local_a0);
    rc::Texture::setImmutable(&local_a0->super_Texture);
    for (levelH = 0; levelH < levels; levelH = levelH + 1) {
      iVar3 = de::max<int>(1,width >> ((byte)levelH & 0x1f));
      iVar4 = de::max<int>(1,height >> ((byte)levelH & 0x1f));
      rc::Texture2DArray::allocLevel(local_a0,levelH,&local_38,iVar3,iVar4,depth);
    }
  }
  else if (target == 0x806f) {
    if (*(long *)((long)storageFmt + 0x20) == 0) {
      local_a8 = (Texture3D *)((long)storageFmt + 0x3158);
    }
    else {
      local_a8 = *(Texture3D **)((long)storageFmt + 0x20);
    }
    do {
      if ((((this->m_limits).maxTexture3DSize < width) ||
          ((this->m_limits).maxTexture3DSize < height)) ||
         ((this->m_limits).maxTexture3DSize < depth)) {
        setError(this,0x501);
        return;
      }
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
    do {
      bVar1 = rc::Texture::isImmutable(&local_a8->super_Texture);
      if (bVar1) {
        setError(this,0x502);
        return;
      }
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
    rc::Texture3D::clearLevels(local_a8);
    rc::Texture::setImmutable(&local_a8->super_Texture);
    for (levelH_1 = 0; levelH_1 < levels; levelH_1 = levelH_1 + 1) {
      bVar5 = (byte)levelH_1;
      iVar3 = de::max<int>(1,width >> (bVar5 & 0x1f));
      iVar4 = de::max<int>(1,height >> (bVar5 & 0x1f));
      depth_00 = de::max<int>(1,depth >> (bVar5 & 0x1f));
      rc::Texture3D::allocLevel(local_a8,levelH_1,&local_38,iVar3,iVar4,depth_00);
    }
  }
  else if (target == 0x9009) {
    if (*(long *)((long)storageFmt + 0x28) == 0) {
      local_b0 = (TextureCubeArray *)((long)storageFmt + 0x3708);
    }
    else {
      local_b0 = *(TextureCubeArray **)((long)storageFmt + 0x28);
    }
    do {
      if ((((width != height) || (depth % 6 != 0)) || ((this->m_limits).maxTexture2DSize < width))
         || ((this->m_limits).maxTexture2DArrayLayers <= depth)) {
        setError(this,0x501);
        return;
      }
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
    do {
      bVar1 = rc::Texture::isImmutable(&local_b0->super_Texture);
      if (bVar1) {
        setError(this,0x502);
        return;
      }
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
    rc::TextureCubeArray::clearLevels(local_b0);
    rc::Texture::setImmutable(&local_b0->super_Texture);
    for (levelH_2 = 0; levelH_2 < levels; levelH_2 = levelH_2 + 1) {
      iVar3 = de::max<int>(1,width >> ((byte)levelH_2 & 0x1f));
      iVar4 = de::max<int>(1,height >> ((byte)levelH_2 & 0x1f));
      rc::TextureCubeArray::allocLevel(local_b0,levelH_2,&local_38,iVar3,iVar4,depth);
    }
  }
  else {
    setError(this,0x500);
  }
  return;
}

Assistant:

void ReferenceContext::texStorage3D (deUint32 target, int levels, deUint32 internalFormat, int width, int height, int depth)
{
	TextureUnit&		unit		= m_textureUnits[m_activeTexture];
	TextureFormat		storageFmt;

	RC_IF_ERROR(width <= 0 || height <= 0, GL_INVALID_VALUE, RC_RET_VOID);
	RC_IF_ERROR(!de::inRange(levels, 1, (int)deLog2Floor32(de::max(width, height))+1), GL_INVALID_VALUE, RC_RET_VOID);

	// Map storage format.
	storageFmt = mapInternalFormat(internalFormat);
	RC_IF_ERROR(storageFmt.order	== TextureFormat::CHANNELORDER_LAST ||
				storageFmt.type		== TextureFormat::CHANNELTYPE_LAST, GL_INVALID_ENUM, RC_RET_VOID);

	if (target == GL_TEXTURE_2D_ARRAY)
	{
		Texture2DArray& texture = unit.tex2DArrayBinding ? *unit.tex2DArrayBinding : unit.default2DArrayTex;

		RC_IF_ERROR(width	>	m_limits.maxTexture2DSize	||
					height	>=	m_limits.maxTexture2DSize	||
					depth	>=	m_limits.maxTexture2DArrayLayers, GL_INVALID_VALUE, RC_RET_VOID);
		RC_IF_ERROR(texture.isImmutable(), GL_INVALID_OPERATION, RC_RET_VOID);

		texture.clearLevels();
		texture.setImmutable();

		for (int level = 0; level < levels; level++)
		{
			int levelW = de::max(1, width >> level);
			int levelH = de::max(1, height >> level);

			texture.allocLevel(level, storageFmt, levelW, levelH, depth);
		}
	}
	else if (target == GL_TEXTURE_3D)
	{
		Texture3D& texture = unit.tex3DBinding ? *unit.tex3DBinding : unit.default3DTex;

		RC_IF_ERROR(width	> m_limits.maxTexture3DSize	||
					height	> m_limits.maxTexture3DSize	||
					depth	> m_limits.maxTexture3DSize, GL_INVALID_VALUE, RC_RET_VOID);
		RC_IF_ERROR(texture.isImmutable(), GL_INVALID_OPERATION, RC_RET_VOID);

		texture.clearLevels();
		texture.setImmutable();

		for (int level = 0; level < levels; level++)
		{
			int levelW = de::max(1, width		>> level);
			int levelH = de::max(1, height	>> level);
			int levelD = de::max(1, depth		>> level);

			texture.allocLevel(level, storageFmt, levelW, levelH, levelD);
		}
	}
	else if (target == GL_TEXTURE_CUBE_MAP_ARRAY)
	{
		TextureCubeArray& texture = unit.texCubeArrayBinding ? *unit.texCubeArrayBinding : unit.defaultCubeArrayTex;

		RC_IF_ERROR(width		!=	height								||
					depth % 6	!= 0									||
					width		>	m_limits.maxTexture2DSize			||
					depth		>=	m_limits.maxTexture2DArrayLayers, GL_INVALID_VALUE, RC_RET_VOID);
		RC_IF_ERROR(texture.isImmutable(), GL_INVALID_OPERATION, RC_RET_VOID);

		texture.clearLevels();
		texture.setImmutable();

		for (int level = 0; level < levels; level++)
		{
			int levelW = de::max(1, width >> level);
			int levelH = de::max(1, height >> level);

			texture.allocLevel(level, storageFmt, levelW, levelH, depth);
		}
	}
	else
		RC_ERROR_RET(GL_INVALID_ENUM, RC_RET_VOID);
}